

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLAssetLoader15.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::AssetLoader15::data__up_axis(AssetLoader15 *this,ENUM__up_axis_enum value)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = (ulong)value;
  if (3 < value - ENUM__up_axis_enum__Y_UP) {
    uVar2 = 0;
  }
  iVar1 = (*(this->mLoader->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0x36])(this->mLoader,uVar2);
  return SUB41(iVar1,0);
}

Assistant:

bool AssetLoader15::data__up_axis( const COLLADASaxFWL15::ENUM__up_axis_enum value )
{
SaxVirtualFunctionTest15(data__up_axis(value));
COLLADASaxFWL::ENUM__UpAxisType val;
switch (value) {
case COLLADASaxFWL15::ENUM__up_axis_enum__X_UP: val=COLLADASaxFWL::ENUM__UpAxisType__X_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__Y_UP: val=COLLADASaxFWL::ENUM__UpAxisType__Y_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__Z_UP: val=COLLADASaxFWL::ENUM__UpAxisType__Z_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__COUNT: val=COLLADASaxFWL::ENUM__UpAxisType__INVALID; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__NOT_PRESENT: val=COLLADASaxFWL::ENUM__UpAxisType__NOT_PRESENT; break;
}
return mLoader->data__up_axis(val);
}